

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camgeom.cc
# Opt level: O1

void gmath::refineOptimal(Matrix33d *F,Vector3d *p0,Vector3d *p1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  double *pdVar9;
  int k_1;
  ulong *puVar10;
  double (*padVar11) [3];
  ulong *puVar12;
  undefined8 *puVar13;
  int i;
  long lVar14;
  double *pdVar15;
  int i_7;
  double (*padVar16) [3];
  int j_2;
  int j;
  long lVar17;
  double *pdVar18;
  int j_5;
  int j_4;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Polynomiald p;
  SVector<double,_3> ret_10;
  SMatrix<double,_3,_3> ret_7;
  SMatrix<double,_3,_3> ret_5;
  Vector3d e1;
  Vector3d e0;
  Matrix33d V;
  Matrix33d U;
  Matrix33d F2;
  vector<double,_std::allocator<double>_> r;
  Matrix33d R1;
  Matrix33d R0;
  Matrix33d invT1;
  Matrix33d invT0;
  Vector3d W;
  Polynomial<double> local_4c8;
  double local_4b8;
  ulong uStack_4b0;
  double local_4a8;
  ulong uStack_4a0;
  undefined1 local_498 [16];
  double local_488;
  double local_480;
  double local_478;
  undefined8 uStack_470;
  double local_468;
  ulong uStack_460;
  double local_458;
  undefined8 uStack_450;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined8 local_408;
  double local_3f8;
  undefined8 uStack_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined1 local_398 [16];
  double local_388;
  undefined1 local_378 [16];
  double local_368;
  double local_358;
  undefined8 uStack_350;
  double local_348;
  undefined8 uStack_340;
  double local_338;
  ulong uStack_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  double local_2e8;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  double local_298;
  double local_288;
  double local_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  double local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  ulong local_188 [4];
  ulong local_168 [6];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined8 local_f8;
  double local_e8 [10];
  double local_98;
  undefined8 uStack_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  undefined1 local_48 [16];
  double local_38;
  
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  local_e8[4] = 0.0;
  local_e8[3] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[8] = 0.0;
  lVar6 = 0;
  auVar42 = _DAT_00121070;
  do {
    if (SUB164(auVar42 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar42 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_e8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_e8 + lVar6 + 0x20) = 0x3ff0000000000000;
    }
    lVar14 = auVar42._8_8_;
    auVar42._0_8_ = auVar42._0_8_ + 2;
    auVar42._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  local_108 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_f8 = 0;
  lVar6 = 0;
  auVar35 = _DAT_00121070;
  do {
    if (SUB164(auVar35 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar35 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_138 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_118 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar35._8_8_;
    auVar35._0_8_ = auVar35._0_8_ + 2;
    auVar35._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  local_e8[2] = p0->v[0] / p0->v[2];
  local_e8[5] = p0->v[1] / p0->v[2];
  local_128._0_8_ = p1->v[0] / p1->v[2];
  local_118._8_8_ = p1->v[1] / p1->v[2];
  local_2f8 = ZEXT816(0);
  local_308 = ZEXT816(0);
  local_318 = ZEXT816(0);
  local_328 = ZEXT816(0);
  local_2e8 = 0.0;
  lVar6 = 0;
  auVar21 = _DAT_00121070;
  do {
    if (SUB164(auVar21 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar21 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_328 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_308 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar21._8_8_;
    auVar21._0_8_ = auVar21._0_8_ + 2;
    auVar21._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_328;
  puVar8 = (undefined8 *)local_138;
  lVar6 = 0;
  do {
    lVar14 = 0;
    puVar13 = puVar8;
    do {
      *(undefined8 *)(puVar7 + lVar14 * 8) = *puVar13;
      lVar14 = lVar14 + 1;
      puVar13 = puVar13 + 3;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
    puVar8 = puVar8 + 1;
  } while (lVar6 != 3);
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_298 = 0.0;
  lVar6 = 0;
  auVar22 = _DAT_00121070;
  do {
    if (SUB164(auVar22 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar22 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_2d8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_2b8 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar22._8_8_;
    auVar22._0_8_ = auVar22._0_8_ + 2;
    auVar22._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_328;
  lVar6 = 0;
  do {
    lVar14 = 0;
    padVar11 = (double (*) [3])F;
    do {
      *(double *)(local_2d8 + lVar14 * 8 + lVar6 * 0x18) = 0.0;
      dVar19 = 0.0;
      lVar17 = 0;
      padVar16 = padVar11;
      do {
        dVar19 = dVar19 + *(double *)(puVar7 + lVar17 * 8) * (*(double (*) [3])*padVar16)[0];
        lVar17 = lVar17 + 1;
        padVar16 = padVar16 + 1;
      } while (lVar17 != 3);
      *(double *)(local_2d8 + lVar14 * 8 + lVar6 * 0x18) = dVar19;
      lVar14 = lVar14 + 1;
      padVar11 = (double (*) [3])(*padVar11 + 1);
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  local_248 = (undefined1  [16])0x0;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_238 = 0.0;
  lVar6 = 0;
  auVar23 = _DAT_00121070;
  do {
    if (SUB164(auVar23 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar23 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_278 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_258 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 2;
    auVar23._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_2d8;
  lVar6 = 0;
  do {
    lVar14 = 0;
    pdVar9 = local_e8;
    do {
      *(double *)(local_278 + lVar14 * 8 + lVar6 * 0x18) = 0.0;
      dVar19 = 0.0;
      lVar17 = 0;
      pdVar15 = pdVar9;
      do {
        dVar19 = dVar19 + *(double *)(puVar7 + lVar17 * 8) * *pdVar15;
        lVar17 = lVar17 + 1;
        pdVar15 = pdVar15 + 3;
      } while (lVar17 != 3);
      *(double *)(local_278 + lVar14 * 8 + lVar6 * 0x18) = dVar19;
      lVar14 = lVar14 + 1;
      pdVar9 = pdVar9 + 1;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  local_2a8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_298 = 0.0;
  lVar6 = 0;
  auVar24 = _DAT_00121070;
  do {
    if (SUB164(auVar24 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar24 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_2d8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_2b8 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar24._8_8_;
    auVar24._0_8_ = auVar24._0_8_ + 2;
    auVar24._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  local_2f8 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_2e8 = 0.0;
  lVar6 = 0;
  auVar25 = _DAT_00121070;
  do {
    if (SUB164(auVar25 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar25 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_328 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_308 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 2;
    auVar25._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  local_48 = (undefined1  [16])0x0;
  lVar6 = 0;
  local_38 = 0.0;
  svd<double,3,3>((SMatrix<double,_3,_3> *)local_278,(SMatrix<double,_3,_3> *)local_2d8,
                  (SVector<double,_3> *)local_48,(SMatrix<double,_3,_3> *)local_328);
  local_368 = 0.0;
  local_378 = (undefined1  [16])0x0;
  puVar8 = (undefined8 *)local_318;
  do {
    *(undefined8 *)(local_378 + lVar6 * 8) = *puVar8;
    lVar6 = lVar6 + 1;
    puVar8 = puVar8 + 3;
  } while (lVar6 != 3);
  local_398 = (undefined1  [16])0x0;
  local_388 = 0.0;
  puVar8 = (undefined8 *)local_2c8;
  lVar6 = 0;
  do {
    *(undefined8 *)(local_398 + lVar6 * 8) = *puVar8;
    lVar6 = lVar6 + 1;
    puVar8 = puVar8 + 3;
  } while (lVar6 != 3);
  dVar19 = (double)local_378._0_8_ * (double)local_378._0_8_ +
           (double)local_378._8_8_ * (double)local_378._8_8_;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  lVar6 = 0;
  do {
    *(double *)(local_378 + lVar6 * 8) = *(double *)(local_378 + lVar6 * 8) / dVar19;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar19 = (double)local_398._0_8_ * (double)local_398._0_8_ +
           (double)local_398._8_8_ * (double)local_398._8_8_;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  lVar6 = 0;
  do {
    *(double *)(local_398 + lVar6 * 8) = *(double *)(local_398 + lVar6 * 8) / dVar19;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_168[2] = 0;
  local_168[3] = 0;
  local_168[1] = 0;
  local_188[2] = 0;
  lVar6 = 0;
  auVar26 = _DAT_00121070;
  do {
    if (SUB164(auVar26 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar26 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_188 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_168 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar26._8_8_;
    auVar26._0_8_ = auVar26._0_8_ + 2;
    auVar26._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  local_188[0] = local_378._0_8_;
  local_188[1] = local_378._8_8_;
  local_188[3] = local_378._8_8_ ^ (ulong)DAT_001210b0;
  local_168[0] = local_378._0_8_;
  local_168[4] = 0x3ff0000000000000;
  local_1a8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  lVar6 = 0;
  auVar27 = _DAT_00121070;
  do {
    if (SUB164(auVar27 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar27 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_1d8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_1b8 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar27._8_8_;
    auVar27._0_8_ = auVar27._0_8_ + 2;
    auVar27._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  local_1d8 = local_398;
  local_1c8._8_8_ = local_398._8_8_ ^ (ulong)DAT_001210b0;
  local_1b8._0_8_ = local_398._0_8_;
  local_198 = 0x3ff0000000000000;
  local_3b8 = (undefined1  [16])0x0;
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3a8 = 0;
  lVar6 = 0;
  auVar28 = _DAT_00121070;
  do {
    if (SUB164(auVar28 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar28 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_3e8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_3c8 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar28._8_8_;
    auVar28._0_8_ = auVar28._0_8_ + 2;
    auVar28._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_1d8;
  lVar6 = 0;
  do {
    lVar14 = 0;
    padVar11 = (double (*) [3])local_278;
    do {
      *(double *)(local_3e8 + lVar14 * 8 + lVar6 * 0x18) = 0.0;
      dVar19 = 0.0;
      lVar17 = 0;
      padVar16 = padVar11;
      do {
        dVar19 = dVar19 + *(double *)(puVar7 + lVar17 * 8) * (*(double (*) [3])*padVar16)[0];
        lVar17 = lVar17 + 1;
        padVar16 = padVar16 + 1;
      } while (lVar17 != 3);
      *(double *)(local_3e8 + lVar14 * 8 + lVar6 * 0x18) = dVar19;
      lVar14 = lVar14 + 1;
      padVar11 = (double (*) [3])(*padVar11 + 1);
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  local_1f8 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_1e8 = 0;
  lVar6 = 0;
  auVar29 = _DAT_00121070;
  do {
    if (SUB164(auVar29 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar29 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_228 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_208 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar29._8_8_;
    auVar29._0_8_ = auVar29._0_8_ + 2;
    auVar29._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_228;
  puVar10 = local_188;
  lVar6 = 0;
  do {
    lVar14 = 0;
    puVar12 = puVar10;
    do {
      *(ulong *)(puVar7 + lVar14 * 8) = *puVar12;
      lVar14 = lVar14 + 1;
      puVar12 = puVar12 + 3;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
    puVar10 = puVar10 + 1;
  } while (lVar6 != 3);
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_408 = 0;
  lVar6 = 0;
  auVar30 = _DAT_00121070;
  do {
    if (SUB164(auVar30 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar30 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_448 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_428 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar30._8_8_;
    auVar30._0_8_ = auVar30._0_8_ + 2;
    auVar30._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_3e8;
  lVar6 = 0;
  do {
    lVar14 = 0;
    pdVar9 = (double *)local_228;
    do {
      *(double *)(local_448 + lVar14 * 8 + lVar6 * 0x18) = 0.0;
      dVar19 = 0.0;
      lVar17 = 0;
      pdVar15 = pdVar9;
      do {
        dVar19 = dVar19 + *(double *)(puVar7 + lVar17 * 8) * *pdVar15;
        lVar17 = lVar17 + 1;
        pdVar15 = pdVar15 + 3;
      } while (lVar17 != 3);
      *(double *)(local_448 + lVar14 * 8 + lVar6 * 0x18) = dVar19;
      lVar14 = lVar14 + 1;
      pdVar9 = pdVar9 + 1;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    *(undefined8 *)(local_268 + lVar6) = *(undefined8 *)(local_438 + lVar6);
    uVar3 = *(undefined8 *)(local_448 + lVar6 + 8);
    *(undefined8 *)(local_278 + lVar6) = *(undefined8 *)(local_448 + lVar6);
    *(undefined8 *)(local_278 + lVar6 + 8) = uVar3;
    dVar19 = local_238;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  local_480 = local_368;
  local_348 = local_388;
  uStack_340 = 0;
  local_4b8 = (double)local_258._0_8_;
  uStack_4b0 = 0;
  uVar3 = local_258._8_8_;
  uVar4 = local_248._8_8_;
  local_4a8 = (double)local_258._8_8_ * (double)local_258._8_8_;
  dVar20 = local_238 * local_238;
  local_4c8.len = 0xc;
  local_4c8.used = 0;
  local_4c8.c = (double *)operator_new__(0x60);
  local_4c8.used = 1;
  *local_4c8.c = 0.0;
  local_338 = local_4b8 * (double)uVar3;
  uStack_330 = uStack_4b0;
  uStack_50 = uStack_4b0 ^ 0x8000000000000000;
  local_58 = -local_338 * dVar20;
  local_280 = local_4a8 * (double)uVar4 * dVar19;
  Polynomial<double>::set(&local_4c8,0,local_280 + local_58);
  local_458 = local_348 * local_348;
  local_468 = local_4b8 * local_4b8;
  local_478 = (double)uVar4 * (double)uVar4;
  uStack_470 = 0;
  local_288 = local_4a8 * local_478;
  uStack_460 = uStack_4b0;
  local_3f8 = local_4a8 + local_4a8;
  uStack_450 = uStack_340;
  Polynomial<double>::set
            (&local_4c8,1,
             dVar20 * dVar20 * local_458 * local_458 +
             local_3f8 * dVar20 * local_458 +
             ((local_4a8 * local_4a8 + local_288) - local_468 * dVar20));
  local_358 = local_480 * local_480;
  local_88 = -local_468;
  uStack_80 = uStack_460 ^ 0x8000000000000000;
  local_338 = local_338 * local_478;
  local_98 = (double)uVar4 * local_88 * dVar19;
  uStack_90 = 0;
  local_78 = (local_4b8 + local_4b8) * (double)uVar3;
  uStack_70 = uStack_4b0;
  uStack_350 = 0;
  local_68 = local_4b8 * 4.0 * (double)uVar3;
  uStack_60 = uStack_4b0;
  Polynomial<double>::set
            (&local_4c8,2,
             (double)uVar4 * 4.0 * dVar20 * dVar19 * local_458 * local_458 +
             local_68 * dVar20 * local_458 +
             local_4a8 * 4.0 * (double)uVar4 * dVar19 * local_458 +
             (((double)uVar4 * local_3f8 * dVar19 * local_358 +
              local_4b8 * 4.0 * local_4a8 * (double)uVar3 + local_338 + local_98) -
             dVar20 * local_78 * local_358));
  dVar36 = local_468 * 6.0 * local_4a8;
  local_4a8 = local_468 + local_468;
  uStack_4a0 = uStack_460;
  Polynomial<double>::set
            (&local_4c8,3,
             local_478 * 6.0 * dVar20 * local_458 * local_458 +
             local_4a8 * dVar20 * local_458 +
             local_4b8 * 8.0 * (double)uVar3 * (double)uVar4 * dVar19 * local_458 +
             local_3f8 * local_478 * local_458 +
             ((dVar36 + local_358 * local_3f8 * local_478) - local_4a8 * dVar20 * local_358));
  local_3f8 = local_358 * local_358;
  uStack_3f0 = uStack_350;
  Polynomial<double>::set
            (&local_4c8,4,
             local_478 * 4.0 * (double)uVar4 * dVar19 * local_458 * local_458 +
             local_468 * 4.0 * (double)uVar4 * dVar19 * local_458 +
             local_68 * local_478 * local_458 +
             local_58 * local_3f8 +
             local_280 * local_3f8 +
             ((local_4b8 * local_468 * 4.0 * (double)uVar3 + local_78 * local_478 * local_358) -
             (double)uVar4 * local_4a8 * dVar19 * local_358));
  Polynomial<double>::set
            (&local_4c8,5,
             local_478 * local_478 * local_458 * local_458 +
             local_4a8 * local_478 * local_458 +
             dVar20 * local_88 * local_3f8 + local_468 * local_468 + local_288 * local_3f8);
  Polynomial<double>::set(&local_4c8,6,local_338 * local_3f8 + local_98 * local_3f8);
  realRoots((vector<double,_std::allocator<double>_> *)local_228,&local_4c8);
  uVar5 = local_228._0_8_;
  if (local_228._8_8_ - local_228._0_8_ == 0) {
    dVar20 = 1.79769313486232e+308;
    dVar36 = 1.79769313486232e+308;
  }
  else {
    lVar6 = (long)(local_228._8_8_ - local_228._0_8_) >> 3;
    dVar36 = 1.79769313486232e+308;
    lVar14 = 0;
    dVar20 = 1.79769313486232e+308;
    do {
      dVar37 = *(double *)(local_228._0_8_ + lVar14 * 8);
      dVar39 = local_4b8 * dVar37 + (double)uVar3;
      dVar40 = (double)uVar4 * dVar37 + dVar19;
      dVar39 = dVar39 * dVar39 + local_458 * dVar40 * dVar40;
      if ((dVar39 != 0.0) || (NAN(dVar39))) {
        auVar41._0_8_ = dVar37 * dVar37;
        auVar41._8_8_ = dVar40 * dVar40;
        auVar2._8_8_ = dVar39;
        auVar2._0_8_ = local_358 * dVar37 * dVar37 + 1.0;
        auVar42 = divpd(auVar41,auVar2);
        dVar39 = auVar42._8_8_ + auVar42._0_8_;
        if (dVar39 < dVar36) {
          dVar20 = dVar37;
          dVar36 = dVar39;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar14);
  }
  if (((local_358 <= 0.0) ||
      (dVar37 = local_458 * (double)uVar4 * (double)uVar4 + local_468, dVar37 <= 0.0)) ||
     (auVar38._8_8_ = local_478, auVar38._0_8_ = 0x3ff0000000000000, auVar1._8_8_ = dVar37,
     auVar1._0_8_ = local_358, auVar42 = divpd(auVar38,auVar1),
     dVar36 <= auVar42._8_8_ + auVar42._0_8_)) {
    p0->v[0] = local_480 * dVar20 * dVar20;
    p0->v[1] = dVar20;
    p0->v[2] = dVar20 * dVar20 * local_358 + 1.0;
    dVar19 = (double)uVar4 * dVar20 + dVar19;
    dVar20 = local_4b8 * dVar20 + (double)uVar3;
    p1->v[0] = dVar19 * local_348 * dVar19;
    p1->v[1] = dVar19 * -dVar20;
    dVar19 = local_458 * dVar19 * dVar19 + dVar20 * dVar20;
  }
  else {
    p0->v[0] = local_480;
    p0->v[1] = 0.0;
    p0->v[2] = local_358;
    p1->v[0] = local_478 * local_348;
    p1->v[1] = -local_4b8 * (double)uVar4;
    dVar19 = local_458 * local_478 + local_468;
  }
  p1->v[2] = dVar19;
  auVar42 = _DAT_00121080;
  local_3b8 = ZEXT816(0);
  local_3c8 = ZEXT816(0);
  local_3d8 = ZEXT816(0);
  local_3e8 = ZEXT816(0);
  local_3a8 = 0;
  lVar6 = 0;
  auVar31 = _DAT_00121070;
  do {
    if (SUB164(auVar31 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar31 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_3e8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_3c8 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar31._8_8_;
    auVar31._0_8_ = auVar31._0_8_ + 2;
    auVar31._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_3e8;
  puVar10 = local_188;
  lVar6 = 0;
  do {
    lVar14 = 0;
    puVar12 = puVar10;
    do {
      *(ulong *)(puVar7 + lVar14 * 8) = *puVar12;
      lVar14 = lVar14 + 1;
      puVar12 = puVar12 + 3;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
    puVar10 = puVar10 + 1;
  } while (lVar6 != 3);
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_408 = 0;
  lVar6 = 0;
  auVar32 = _DAT_00121070;
  do {
    if (SUB164(auVar32 ^ _DAT_00121080,4) == -0x80000000 &&
        SUB164(auVar32 ^ _DAT_00121080,0) < -0x7ffffffd) {
      *(undefined8 *)(local_448 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_428 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar32._8_8_;
    auVar32._0_8_ = auVar32._0_8_ + 2;
    auVar32._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  pdVar9 = local_e8;
  lVar6 = 0;
  do {
    lVar14 = 0;
    pdVar15 = (double *)local_3e8;
    do {
      *(double *)(local_448 + lVar14 * 8 + lVar6 * 0x18) = 0.0;
      dVar19 = 0.0;
      lVar17 = 0;
      pdVar18 = pdVar15;
      do {
        dVar19 = dVar19 + pdVar9[lVar17] * *pdVar18;
        lVar17 = lVar17 + 1;
        pdVar18 = pdVar18 + 3;
      } while (lVar17 != 3);
      *(double *)(local_448 + lVar14 * 8 + lVar6 * 0x18) = dVar19;
      lVar14 = lVar14 + 1;
      pdVar15 = pdVar15 + 1;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar6 != 3);
  local_498 = (undefined1  [16])0x0;
  local_488 = 0.0;
  puVar7 = local_448;
  lVar6 = 0;
  do {
    dVar19 = *(double *)(local_498 + lVar6 * 8);
    lVar14 = 0;
    do {
      dVar19 = dVar19 + *(double *)(puVar7 + lVar14 * 8) * p0->v[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    *(double *)(local_498 + lVar6 * 8) = dVar19;
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  p0->v[2] = local_488;
  p0->v[0] = (double)local_498._0_8_;
  p0->v[1] = (double)local_498._8_8_;
  local_3b8 = ZEXT816(0);
  local_3c8 = ZEXT816(0);
  local_3d8 = ZEXT816(0);
  local_3e8 = ZEXT816(0);
  local_3a8 = 0;
  lVar6 = 0;
  auVar33 = _DAT_00121070;
  do {
    auVar35 = auVar33 ^ auVar42;
    if (auVar35._4_4_ == -0x80000000 && auVar35._0_4_ < -0x7ffffffd) {
      *(undefined8 *)(local_3e8 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_3c8 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar33._8_8_;
    auVar33._0_8_ = auVar33._0_8_ + 2;
    auVar33._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_3e8;
  puVar8 = (undefined8 *)local_1d8;
  lVar6 = 0;
  do {
    lVar14 = 0;
    puVar13 = puVar8;
    do {
      *(undefined8 *)(puVar7 + lVar14 * 8) = *puVar13;
      lVar14 = lVar14 + 1;
      puVar13 = puVar13 + 3;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
    puVar8 = puVar8 + 1;
  } while (lVar6 != 3);
  local_418 = (undefined1  [16])0x0;
  local_428 = (undefined1  [16])0x0;
  local_438 = (undefined1  [16])0x0;
  local_448 = (undefined1  [16])0x0;
  local_408 = 0;
  lVar6 = 0;
  auVar34 = _DAT_00121070;
  do {
    auVar35 = auVar34 ^ auVar42;
    if (auVar35._4_4_ == -0x80000000 && auVar35._0_4_ < -0x7ffffffd) {
      *(undefined8 *)(local_448 + lVar6) = 0x3ff0000000000000;
      *(undefined8 *)(local_428 + lVar6) = 0x3ff0000000000000;
    }
    lVar14 = auVar34._8_8_;
    auVar34._0_8_ = auVar34._0_8_ + 2;
    auVar34._8_8_ = lVar14 + 2;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x80);
  puVar7 = local_138;
  lVar6 = 0;
  do {
    lVar14 = 0;
    pdVar9 = (double *)local_3e8;
    do {
      *(double *)(local_448 + lVar14 * 8 + lVar6 * 0x18) = 0.0;
      dVar19 = 0.0;
      lVar17 = 0;
      pdVar15 = pdVar9;
      do {
        dVar19 = dVar19 + *(double *)(puVar7 + lVar17 * 8) * *pdVar15;
        lVar17 = lVar17 + 1;
        pdVar15 = pdVar15 + 3;
      } while (lVar17 != 3);
      *(double *)(local_448 + lVar14 * 8 + lVar6 * 0x18) = dVar19;
      lVar14 = lVar14 + 1;
      pdVar9 = pdVar9 + 1;
    } while (lVar14 != 3);
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  local_498 = (undefined1  [16])0x0;
  local_488 = 0.0;
  puVar7 = local_448;
  lVar6 = 0;
  do {
    dVar19 = *(double *)(local_498 + lVar6 * 8);
    lVar14 = 0;
    do {
      dVar19 = dVar19 + *(double *)(puVar7 + lVar14 * 8) * p1->v[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 3);
    *(double *)(local_498 + lVar6 * 8) = dVar19;
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + 0x18;
  } while (lVar6 != 3);
  p1->v[2] = local_488;
  p1->v[0] = (double)local_498._0_8_;
  p1->v[1] = (double)local_498._8_8_;
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5);
  }
  if (local_4c8.c != (double *)0x0) {
    operator_delete__(local_4c8.c);
  }
  return;
}

Assistant:

void refineOptimal(const Matrix33d &F, Vector3d &p0, Vector3d &p1)
{
  // the implementation follows Hartley and Zisserman's (2003, pp. 318)

  Matrix33d invT0;
  Matrix33d invT1;
  invT0(0, 2)=p0[0]/p0[2];
  invT0(1, 2)=p0[1]/p0[2];
  invT1(0, 2)=p1[0]/p1[2];
  invT1(1, 2)=p1[1]/p1[2];

  // transform F

  Matrix33d F2=transpose(invT1)*F*invT0;

  // get epipoles of new fundamental matrix

  Matrix33d U, V;
  Vector3d W;
  svd(F2, U, W, V);
  Vector3d e0=V.getColumn(2);
  Vector3d e1=U.getColumn(2);

  // compute rotations

  e0/=sqrt(e0[0]*e0[0]+e0[1]*e0[1]);
  e1/=sqrt(e1[0]*e1[0]+e1[1]*e1[1]);
  Matrix33d R0;
  R0(0, 0)=e0[0];
  R0(0, 1)=e0[1];
  R0(1, 0)=-e0[1];
  R0(1, 1)=e0[0];
  R0(2, 2)=1;
  Matrix33d R1;
  R1(0, 0)=e1[0];
  R1(0, 1)=e1[1];
  R1(1, 0)=-e1[1];
  R1(1, 1)=e1[0];
  R1(2, 2)=1;

  // compute new F

  F2=R1*F2*transpose(R0);

  // compute coefficients of polynomial

  const double f=e0[2];
  const double g=e1[2];
  const double a=F2(1, 1);
  const double b=F2(1, 2);
  const double c=F2(2, 1);
  const double d=F2(2, 2);
  const double f2=f*f;
  const double f4=f2*f2;
  const double g2=g*g;
  const double a2=a*a;
  const double b2=b*b;
  const double c2=c*c;
  const double d2=d*d;

  Polynomiald p;
  p.set(0, b2*c*d-a*b*d2);
  p.set(1, b2*b2+b2*c2-a2*d2+2*b2*d2*g2+d2*d2*g2*g2);
  p.set(2, 4*a*b2*b+a*b*c2-a2*c*d+2*b2*c*d*f2-2*a*b*d2*f2+4*b2*c*d*g2+4*a*b*d2*g2
        +4*c*d2*d*g2*g2);
  p.set(3, 6*a2*b2+2*b2*c2*f2-2*a2*d2*f2+2*b2*c2*g2+8*a*b*c*d*g2+2*a2*d2*g2
        +6*c2*d2*g2*g2);
  p.set(4, 4*a2*a*b+2*a*b*c2*f2-2*a2*c*d*f2+b2*c*d*f4-a*b*d2*f4+4*a*b*c2*g2
        +4*a2*c*d*g2+4*c2*c*d*g2*g2);
  p.set(5, a2*a2+b2*c2*f4-a2*d2*f4+2*a2*c2*g2+c2*c2*g2*g2);
  p.set(6, a*b*c2*f4-a2*c*d*f4);

  // setting polynomial to 0 and get all real roots

  std::vector<double> r=realRoots(p);

  // find global minima (solution is t)

  double t=std::numeric_limits<double>::max();
  double mins=std::numeric_limits<double>::max();

  for (size_t i=0; i<r.size(); i++)
  {
    double s=(a*r[i]+b)*(a*r[i]+b)+g*g*(c*r[i]+d)*(c*r[i]+d);

    if (s != 0)
    {
      s=r[i]*r[i]/(1+f*f*r[i]*r[i])+(c*r[i]+d)*(c*r[i]+d)/s;

      if (s < mins)
      {
        t=r[i];
        mins=s;
      }
    }
  }

  // get optimal corner positions

  if (f*f > 0 && a*a+g*g*c*c > 0 && 1/(f*f)+c*c/(a*a+g*g*c*c) < mins)
  {
    p0[0]=f;
    p0[1]=0;
    p0[2]=f2;
    p1[0]=g*c2;
    p1[1]=-a*c;
    p1[2]=g2*c2+a2;
  }
  else
  {
    p0[0]=t*t*f;
    p0[1]=t;
    p0[2]=t*t*f2+1;
    p1[0]=g*(c*t+d)*(c*t+d);
    p1[1]=-(a*t+b)*(c*t+d);
    p1[2]=g2*(c*t+d)*(c*t+d)+(a*t+b)*(a*t+b);
  }

  // transform refined points back

  p0=invT0*transpose(R0)*p0;
  p1=invT1*transpose(R1)*p1;
}